

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloth_decorator.h
# Opt level: O2

void __thiscall
decorator::ClothDecorator::ClothDecorator(ClothDecorator *this,shared_ptr<decorator::Human> *human)

{
  __shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&human->super___shared_ptr<decorator::Human,_(__gnu_cxx::_Lock_policy)2>);
  WomenDecorator::WomenDecorator
            (&this->super_WomenDecorator,(shared_ptr<decorator::Human> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (this->super_WomenDecorator).super_Human._vptr_Human = (_func_int **)&PTR_Outlook_001368c0;
  return;
}

Assistant:

ClothDecorator::ClothDecorator(std::shared_ptr<Human> human)
        : WomenDecorator(human) {}